

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp.cpp
# Opt level: O0

lzham_compress_state_ptr lzham::lzham_lib_compress_init(lzham_compress_params *pParams)

{
  int iVar1;
  lzham_compress_status_t lVar2;
  uint uVar3;
  int *in_RDI;
  lzham_compress_state *pState;
  lzham_compress_status_t status;
  init_params params;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  task_pool *in_stack_ffffffffffffffc8;
  uint local_30;
  lzham_compress_state *local_8;
  
  if ((in_RDI == (int *)0x0) || (*in_RDI != 0x1c)) {
    local_8 = (lzham_compress_state *)0x0;
  }
  else if (((uint)in_RDI[1] < 0xf) || (0x1d < (uint)in_RDI[1])) {
    local_8 = (lzham_compress_state *)0x0;
  }
  else {
    lzcompressor::init_params::init_params((init_params *)&stack0xffffffffffffffc8);
    lVar2 = create_init_params((init_params *)in_stack_ffffffffffffffc8,
                               (lzham_compress_params *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (lVar2 == LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
      local_8 = lzham_new<lzham::lzham_compress_state>();
      if (local_8 == (lzham_compress_state *)0x0) {
        local_8 = (lzham_compress_state *)0x0;
      }
      else {
        iVar1 = in_RDI[1];
        (local_8->m_params).m_struct_size = in_RDI[0];
        (local_8->m_params).m_dict_size_log2 = iVar1;
        iVar1 = in_RDI[3];
        (local_8->m_params).m_level = in_RDI[2];
        (local_8->m_params).m_max_helper_threads = iVar1;
        iVar1 = in_RDI[5];
        (local_8->m_params).m_cpucache_total_lines = in_RDI[4];
        (local_8->m_params).m_cpucache_line_size = iVar1;
        (local_8->m_params).m_compress_flags = in_RDI[6];
        local_8->m_pIn_buf = (uint8 *)0x0;
        local_8->m_pIn_buf_size = (size_t *)0x0;
        local_8->m_pOut_buf = (uint8 *)0x0;
        local_8->m_pOut_buf_size = (size_t *)0x0;
        local_8->m_status = LZHAM_COMP_STATUS_NOT_FINISHED;
        local_8->m_comp_data_ofs = 0;
        local_8->m_flushed_compressor = false;
        if (local_30 != 0) {
          uVar3 = task_pool::init(&local_8->m_tp,(EVP_PKEY_CTX *)(ulong)local_30);
          if ((uVar3 & 1) == 0) {
            lzham_delete<lzham::lzham_compress_state>((lzham_compress_state *)0x117477);
            return (lzham_compress_state_ptr)0x0;
          }
          task_pool::get_num_threads(&local_8->m_tp);
        }
        uVar3 = lzcompressor::init(&local_8->m_compressor,(EVP_PKEY_CTX *)&stack0xffffffffffffffc8);
        if ((uVar3 & 1) == 0) {
          lzham_delete<lzham::lzham_compress_state>((lzham_compress_state *)0x1174c8);
          local_8 = (lzham_compress_state *)0x0;
        }
      }
    }
    else {
      local_8 = (lzham_compress_state *)0x0;
    }
  }
  return local_8;
}

Assistant:

lzham_compress_state_ptr lzham_lib_compress_init(const lzham_compress_params *pParams)
   {
      if ((!pParams) || (pParams->m_struct_size != sizeof(lzham_compress_params)))   
         return NULL;

      if ((pParams->m_dict_size_log2 < CLZBase::cMinDictSizeLog2) || (pParams->m_dict_size_log2 > CLZBase::cMaxDictSizeLog2))
         return NULL;
      
      lzcompressor::init_params params;
      lzham_compress_status_t status = create_init_params(params, pParams);
      if (status != LZHAM_COMP_STATUS_SUCCESS)
         return NULL;
      
      lzham_compress_state *pState = lzham_new<lzham_compress_state>();
      if (!pState)
         return NULL;

      pState->m_params = *pParams;
      
      pState->m_pIn_buf = NULL;
      pState->m_pIn_buf_size = NULL;
      pState->m_pOut_buf = NULL;
      pState->m_pOut_buf_size = NULL;
      pState->m_status = LZHAM_COMP_STATUS_NOT_FINISHED;
      pState->m_comp_data_ofs = 0;
      pState->m_flushed_compressor = false;
      
      if (params.m_max_helper_threads)
      {
         if (!pState->m_tp.init(params.m_max_helper_threads))
         {
            lzham_delete(pState);
            return NULL;
         }
         if (pState->m_tp.get_num_threads() >= params.m_max_helper_threads)
         {
            params.m_pTask_pool = &pState->m_tp;
         }
         else
         {
            params.m_max_helper_threads = 0;
         }
      }
                  
      if (!pState->m_compressor.init(params))
      {
         lzham_delete(pState);
         return NULL;
      }
      
      return pState;
   }